

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_name_resolver.cc
# Opt level: O0

string * google::protobuf::compiler::java::anon_unknown_0::StripPackageName
                   (string *__return_storage_ptr__,string *full_name,FileDescriptor *file)

{
  ulong uVar1;
  FileDescriptor *file_local;
  string *full_name_local;
  
  FileDescriptor::package_abi_cxx11_(file);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    FileDescriptor::package_abi_cxx11_(file);
    std::__cxx11::string::size();
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)full_name);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)full_name);
  }
  return __return_storage_ptr__;
}

Assistant:

string StripPackageName(const string& full_name,
                        const FileDescriptor* file) {
  if (file->package().empty()) {
    return full_name;
  } else {
    // Strip package name
    return full_name.substr(file->package().size() + 1);
  }
}